

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O3

int stlstp_(double *y,int *n,int *np,int *ns,int *nt,int *nl,int *isdeg,int *itdeg,int *ildeg,
           int *nsjump,int *ntjump,int *nljump,int *ni,int *userw,double *rw,double *season,
           double *trend,double *work)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  double *y_00;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  int local_4c;
  int local_48;
  int c_false;
  double *local_40;
  uint local_34;
  
  local_4c = 0;
  local_48 = *ni;
  if (0 < local_48) {
    uVar1 = *n + *np * 2;
    c_false = *n * 2 + *np * 4 + 1;
    lVar5 = (long)(int)uVar1;
    lVar6 = (long)(int)~uVar1;
    local_40 = work + lVar6 + (long)(int)(uVar1 * 3) + 1;
    iVar4 = 1;
    do {
      uVar2 = *n;
      if (0 < (int)uVar2) {
        uVar7 = 0;
        do {
          work[lVar6 + lVar5 + uVar7 + 1] = y[uVar7] - trend[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
      stlss_(work,n,np,ns,isdeg,nsjump,userw,rw,work + lVar6 + (int)(uVar1 * 2 + 1),local_40,
             work + lVar6 + (int)(uVar1 * 4 + 1),work + lVar6 + (long)(int)(uVar1 * 5) + 1,season);
      y_00 = local_40;
      local_34 = *np * 2 + *n;
      stlfts_(work + lVar6 + (int)(uVar1 * 2 + 1),(int *)&local_34,np,local_40,work);
      stless_(y_00,n,nl,ildeg,nljump,&local_4c,work + lVar6 + (int)(uVar1 * 4 + 1),work,
              work + lVar6 + (long)(int)(uVar1 * 5) + 1);
      local_34 = *n;
      if (0 < (int)local_34) {
        iVar3 = *np;
        uVar7 = 0;
        do {
          season[uVar7] =
               work[lVar6 + (iVar3 + c_false + (int)uVar7)] - work[lVar6 + lVar5 + uVar7 + 1];
          uVar7 = uVar7 + 1;
        } while (local_34 != uVar7);
        if (0 < (int)local_34) {
          uVar7 = 0;
          do {
            work[lVar6 + lVar5 + uVar7 + 1] = y[uVar7] - season[uVar7];
            uVar7 = uVar7 + 1;
          } while (local_34 != uVar7);
        }
      }
      stless_(work,n,nt,itdeg,ntjump,userw,rw,trend,local_40);
      bVar8 = iVar4 != local_48;
      iVar4 = iVar4 + 1;
    } while (bVar8);
  }
  return 0;
}

Assistant:

int stlstp_(double *y, int *n, int *np, int *ns, int *nt, int *nl, int *isdeg, int *itdeg, int 
	*ildeg, int *nsjump, int *ntjump, int *nljump, int *ni, int *userw, double *rw, double *season,
	double *trend, double *work)
{
    /* System generated locals */
    int work_dim1, work_offset, i__1, i__2;

    /* Local variables */
    int i__, j;
	int c_false = 0;

/* Arg */
/* Var */
    /* Parameter adjustments */
    --trend;
    --season;
    --rw;
    --y;
    work_dim1 = *n + 2 * *np;
    work_offset = 1 + work_dim1;
    work -= work_offset;

    /* Function Body */
    i__1 = *ni;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *n;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    work[i__ + work_dim1] = y[i__] - trend[i__];
/* L1: */
	}
	stlss_(&work[work_dim1 + 1], n, np, ns, isdeg, nsjump, userw, &rw[1], 
		&work[(work_dim1 << 1) + 1], &work[work_dim1 * 3 + 1], &work[(
		work_dim1 << 2) + 1], &work[work_dim1 * 5 + 1], &season[1]);
	i__2 = *n + (*np << 1);
	stlfts_(&work[(work_dim1 << 1) + 1], &i__2, np, &work[work_dim1 * 3 + 
		1], &work[work_dim1 + 1]);
	stless_(&work[work_dim1 * 3 + 1], n, nl, ildeg, nljump, &c_false, &
		work[(work_dim1 << 2) + 1], &work[work_dim1 + 1], &work[
		work_dim1 * 5 + 1]);
	i__2 = *n;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    season[i__] = work[*np + i__ + (work_dim1 << 1)] - work[i__ + 
		    work_dim1];
/* L3: */
	}
	i__2 = *n;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    work[i__ + work_dim1] = y[i__] - season[i__];
/* L5: */
	}
	stless_(&work[work_dim1 + 1], n, nt, itdeg, ntjump, userw, &rw[1], &
		trend[1], &work[work_dim1 * 3 + 1]);
/* L80: */
    }
    return 0;
}